

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::Swap
          (RepeatedPtrFieldStringAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  uint uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  ulong uVar5;
  int index;
  RepeatedPtrFieldBase local_78;
  RepeatedFieldAccessor *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = (RepeatedFieldAccessor *)this;
  if ((RepeatedFieldAccessor *)this == other_mutator) {
    if (data != other_data) {
      if (*other_data != *data) {
        RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  ((RepeatedPtrFieldBase *)data,(RepeatedPtrFieldBase *)other_data);
        return;
      }
      uVar3 = *(undefined8 *)((long)data + 0x10);
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)((long)other_data + 0x10);
      *(undefined8 *)((long)other_data + 0x10) = uVar3;
      uVar2 = *(undefined4 *)((long)data + 8);
      *(undefined4 *)((long)data + 8) = *(undefined4 *)((long)other_data + 8);
      *(undefined4 *)((long)other_data + 8) = uVar2;
      uVar2 = *(undefined4 *)((long)data + 0xc);
      *(undefined4 *)((long)data + 0xc) = *(undefined4 *)((long)other_data + 0xc);
      *(undefined4 *)((long)other_data + 0xc) = uVar2;
    }
  }
  else {
    local_78.arena_ = (Arena *)0x0;
    local_78.current_size_ = 0;
    local_78.total_size_ = 0;
    local_78.rep_ = (Rep *)0x0;
    if (&local_78 != (RepeatedPtrFieldBase *)data) {
      if (*data == 0) {
        local_78.rep_ = *(Rep **)((long)data + 0x10);
        *(undefined8 *)((long)data + 0x10) = 0;
        local_78._8_8_ = *(undefined8 *)((long)data + 8);
        *(undefined8 *)((long)data + 8) = 0;
      }
      else {
        RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&local_78,(RepeatedPtrFieldBase *)data);
      }
    }
    iVar4 = (*other_mutator->_vptr_RepeatedFieldAccessor[1])(other_mutator,other_data);
    if (0 < iVar4) {
      index = 0;
      do {
        RepeatedFieldAccessor::Get<std::__cxx11::string>(&local_50,other_mutator,other_data,index);
        RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                  (local_58,data,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        index = index + 1;
      } while (iVar4 != index);
    }
    uVar1 = *(uint *)((long)data + 8);
    (*other_mutator->_vptr_RepeatedFieldAccessor[3])(other_mutator,other_data);
    if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                  (other_mutator,other_data,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_78.rep_)->elements[uVar5]);
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_78);
  }
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    if (this == other_mutator) {
      MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
    } else {
      RepeatedPtrField<std::string> tmp;
      tmp.Swap(MutableRepeatedField(data));
      int other_size = other_mutator->Size(other_data);
      for (int i = 0; i < other_size; ++i) {
        Add<std::string>(data, other_mutator->Get<std::string>(other_data, i));
      }
      int size = Size(data);
      other_mutator->Clear(other_data);
      for (int i = 0; i < size; ++i) {
        other_mutator->Add<std::string>(other_data, tmp.Get(i));
      }
    }
  }